

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

float __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::readDepth
          (GLFrameBuffer *this,int xPos,int yPos)

{
  GLint in_EDX;
  GLint in_ESI;
  long *in_RDI;
  float result;
  float local_14;
  GLint local_10;
  GLint local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  (*glad_glFlush)();
  (*glad_glFinish)();
  (**(code **)(*in_RDI + 0x10))();
  (*glad_glReadPixels)(local_c,local_10,1,1,0x1902,0x1406,&local_14);
  return local_14;
}

Assistant:

float GLFrameBuffer::readDepth(int xPos, int yPos) {

  // TODO does no error checking for the case where no depth buffer is attached

  glFlush();
  glFinish();
  bind();

  // Read from the buffer
  float result;
  glReadPixels(xPos, yPos, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &result);

  return result;
}